

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

void __thiscall
capnp::compiler::CompilerMain::addError
          (CompilerMain *this,ReadableDirectory *directory,PathPtr path,SourcePos start,
          SourcePos end,StringPtr message)

{
  size_t sVar1;
  char *pcVar2;
  uint uVar3;
  char (*params_5) [2];
  String wholeMessage;
  int local_6c;
  String local_68;
  int local_4c;
  String file;
  int local_24;
  
  params_5 = (char (*) [2])0x116c20;
  getDisplayName(&file,this,directory,path);
  uVar3 = start.line;
  if (end.line == uVar3) {
    local_6c = uVar3 + 1;
    local_4c = start.column + 1;
    if (end.column == start.column) {
      kj::
      str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
                (&local_68,(kj *)&file,(String *)0x2390e6,(char (*) [2])&local_6c,(uint *)0x2390e6,
                 (char (*) [2])&local_4c,(uint *)": error: ",(char (*) [10])&message,
                 (StringPtr *)0x237f1a,params_5);
    }
    else {
      local_24 = end.column + 1;
      kj::
      str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
                (&local_68,(kj *)&file,(String *)0x2390e6,(char (*) [2])&local_6c,(uint *)0x2390e6,
                 (char (*) [2])&local_4c,(uint *)0x237d2c,(char (*) [2])&local_24,
                 (uint *)": error: ",(char (*) [10])&message,(StringPtr *)0x237f1a,params_5);
    }
  }
  else {
    local_6c = uVar3 + 1;
    kj::
    str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
              (&local_68,(kj *)&file,(String *)0x2390e6,(char (*) [2])&local_6c,(uint *)": error: ",
               (char (*) [10])&message,(StringPtr *)0x237f1a,params_5);
  }
  wholeMessage.content.size_ =
       CONCAT44(local_68.content.size_._4_4_,(undefined4)local_68.content.size_);
  wholeMessage.content.disposer =
       (ArrayDisposer *)CONCAT44(local_68.content.disposer._4_4_,local_68.content.disposer._0_4_);
  pcVar2 = local_68.content.ptr;
  if (wholeMessage.content.size_ == 0) {
    pcVar2 = "";
  }
  (*this->context->_vptr_ProcessContext[3])
            (this->context,pcVar2,wholeMessage.content.size_ + (wholeMessage.content.size_ == 0));
  this->hadErrors_ = true;
  if (local_68.content.ptr != (char *)0x0) {
    (**(wholeMessage.content.disposer)->_vptr_ArrayDisposer)
              (wholeMessage.content.disposer,local_68.content.ptr,1,wholeMessage.content.size_,
               wholeMessage.content.size_,0,0,0);
  }
  sVar1 = file.content.size_;
  pcVar2 = file.content.ptr;
  if (file.content.ptr != (char *)0x0) {
    file.content.ptr = (char *)0x0;
    file.content.size_ = 0;
    (**(file.content.disposer)->_vptr_ArrayDisposer)(file.content.disposer,pcVar2,1,sVar1,sVar1,0);
  }
  return;
}

Assistant:

void addError(const kj::ReadableDirectory& directory, kj::PathPtr path,
                SourcePos start, SourcePos end,
                kj::StringPtr message) override {
    auto file = getDisplayName(directory, path);

    kj::String wholeMessage;
    if (end.line == start.line) {
      if (end.column == start.column) {
        wholeMessage = kj::str(file, ":", start.line + 1, ":", start.column + 1,
                               ": error: ", message, "\n");
      } else {
        wholeMessage = kj::str(file, ":", start.line + 1, ":", start.column + 1,
                               "-", end.column + 1, ": error: ", message, "\n");
      }
    } else {
      // The error spans multiple lines, so just report it on the first such line.
      wholeMessage = kj::str(file, ":", start.line + 1, ": error: ", message, "\n");
    }

    context.error(wholeMessage);
    hadErrors_ = true;
  }